

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O1

void __thiscall memory::memory(memory *this,longlong cap)

{
  uchar *puVar1;
  long lVar2;
  
  this->PC = 0;
  this->count = 0;
  this->capacity = cap;
  puVar1 = (uchar *)operator_new__(cap);
  this->mem = puVar1;
  this->jump_flag = false;
  if (0 < cap) {
    lVar2 = 0;
    do {
      this->mem[lVar2] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->capacity);
  }
  return;
}

Assistant:

memory::memory(long long cap) {
   PC=0;
   count=0;
   capacity=cap;
   mem=new unsigned char[cap];
   jump_flag=false;
   for(int i=0;i<capacity;++i){
       mem[i]=0;
   }
}